

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O1

void __thiscall pbrt::CheckCallbackScope::~CheckCallbackScope(CheckCallbackScope *this)

{
  int vb;
  size_type va;
  
  va = DAT_031a4b28 - callbacks_abi_cxx11_ >> 5;
  vb = 0;
  if (DAT_031a4b28 != callbacks_abi_cxx11_) {
    std::
    vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
    ::pop_back((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
                *)&callbacks_abi_cxx11_);
    return;
  }
  LogFatal<char_const(&)[17],char_const(&)[2],char_const(&)[17],unsigned_long&,char_const(&)[2],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/check.cpp"
             ,0xa9,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [17])"callbacks.size()",
             (char (*) [2])0x5e8297,(char (*) [17])"callbacks.size()",&va,(char (*) [2])0x5e8297,&vb
            );
}

Assistant:

CheckCallbackScope::~CheckCallbackScope() {
    CHECK_GT(callbacks.size(), 0);
    callbacks.pop_back();
}